

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O2

int xcb_input_feedback_ctl_data_serialize
              (void **_buffer,uint8_t class_id,xcb_input_feedback_ctl_data_t *_aux)

{
  long lVar1;
  void *__src;
  uint uVar2;
  size_t *psVar3;
  void *__dest;
  int iVar4;
  int iVar5;
  undefined7 in_register_00000031;
  ulong uVar6;
  size_t __n;
  uint uVar7;
  long in_FS_OFFSET;
  size_t sStack_1d0;
  char xcb_pad0 [3];
  iovec xcb_parts [24];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __dest = *_buffer;
  xcb_pad0[2] = '\0';
  xcb_pad0[0] = '\0';
  xcb_pad0[1] = '\0';
  memset(xcb_parts,0xaa,0x180);
  switch(CONCAT71(in_register_00000031,class_id) & 0xffffffff) {
  case 0:
    psVar3 = &xcb_parts[7].iov_len;
    xcb_parts[0].iov_base = _aux;
    xcb_parts[0].iov_len = 1;
    xcb_parts[1].iov_base = &(_aux->keyboard).auto_repeat_mode;
    xcb_parts[1].iov_len = 1;
    xcb_parts[2].iov_base = &(_aux->keyboard).key_click_percent;
    xcb_parts[2].iov_len = 1;
    xcb_parts[3].iov_base = &(_aux->keyboard).bell_percent;
    xcb_parts[3].iov_len = 1;
    xcb_parts[4].iov_base = &(_aux->keyboard).bell_pitch;
    xcb_parts[4].iov_len = 2;
    xcb_parts[5].iov_base = &(_aux->keyboard).bell_duration;
    xcb_parts[5].iov_len = 2;
    xcb_parts[6].iov_base = &(_aux->keyboard).led_mask;
    xcb_parts[6].iov_len = 4;
    xcb_parts[7].iov_base = &(_aux->keyboard).led_values;
    iVar4 = 0x10;
    uVar7 = 8;
    break;
  case 1:
    psVar3 = &xcb_parts[3].iov_len;
    xcb_parts[0].iov_base = xcb_pad0;
    sStack_1d0 = 2;
    xcb_parts[0].iov_len = 2;
    xcb_parts[1].iov_base = &(_aux->pointer).num;
    xcb_parts[1].iov_len = 2;
    xcb_parts[2].iov_base = &(_aux->pointer).denom;
    xcb_parts[2].iov_len = 2;
    xcb_parts[3].iov_base = &(_aux->pointer).threshold;
    iVar4 = 8;
    uVar7 = 4;
    uVar2 = 1;
    iVar5 = 0;
    goto LAB_0017dd19;
  case 2:
    psVar3 = &xcb_parts[2].iov_len;
    xcb_parts[0].iov_base = xcb_pad0;
    xcb_parts[0].iov_len = 2;
    xcb_parts[1].iov_base = &(_aux->string).num_keysyms;
    xcb_parts[1].iov_len = 2;
    xcb_parts[2].iov_base = (_aux->string).keysyms;
    sStack_1d0 = (ulong)(_aux->string).num_keysyms << 2;
    iVar4 = (int)sStack_1d0;
    uVar2 = 3;
    iVar5 = 4;
    uVar7 = uVar2;
    goto LAB_0017dd19;
  case 3:
    psVar3 = &xcb_parts[0].iov_len;
    xcb_parts[0].iov_base = &_aux->integer;
    iVar4 = 4;
    uVar7 = 1;
    break;
  case 4:
    psVar3 = &xcb_parts[1].iov_len;
    xcb_parts[0].iov_base = &_aux->led;
    xcb_parts[0].iov_len = 4;
    xcb_parts[1].iov_base = &(_aux->led).led_values;
    iVar4 = 8;
    uVar7 = 2;
    break;
  case 5:
    psVar3 = &xcb_parts[3].iov_len;
    xcb_parts[0].iov_base = &_aux->bell;
    xcb_parts[0].iov_len = 1;
    xcb_parts[1].iov_base = xcb_pad0;
    xcb_parts[1].iov_len = 3;
    xcb_parts[2].iov_base = &(_aux->bell).pitch;
    xcb_parts[2].iov_len = 2;
    xcb_parts[3].iov_base = &(_aux->bell).duration;
    iVar4 = 8;
    uVar7 = 4;
    uVar2 = 1;
    sStack_1d0 = 2;
    goto LAB_0017dd18;
  default:
    uVar2 = 0xffffffff;
    iVar5 = 0;
    uVar7 = 0;
    iVar4 = 0;
    goto LAB_0017dd1c;
  }
  uVar2 = 3;
  sStack_1d0 = 4;
LAB_0017dd18:
  iVar5 = 0;
LAB_0017dd19:
  *psVar3 = sStack_1d0;
LAB_0017dd1c:
  uVar2 = -iVar4 & uVar2;
  if (uVar2 != 0) {
    *(char **)((long)&xcb_parts[0].iov_base + (ulong)(uVar7 << 4)) = xcb_pad0;
    *(ulong *)((long)&xcb_parts[0].iov_len + (ulong)(uVar7 << 4)) = (ulong)uVar2;
    uVar7 = uVar7 + 1;
  }
  uVar2 = iVar5 + iVar4 + uVar2;
  if (__dest == (void *)0x0) {
    __dest = malloc((ulong)uVar2);
    *_buffer = __dest;
  }
  for (uVar6 = 0; uVar7 << 4 != uVar6; uVar6 = uVar6 + 0x10) {
    __src = *(void **)((long)&xcb_parts[0].iov_base + uVar6);
    __n = *(size_t *)((long)&xcb_parts[0].iov_len + uVar6);
    if (__src != (void *)0x0) {
      if (__n == 0) {
        __n = 0;
      }
      else {
        memcpy(__dest,__src,__n);
      }
    }
    __dest = (void *)((long)__dest + __n);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return uVar2;
}

Assistant:

int
xcb_input_feedback_ctl_data_serialize (void                                **_buffer,
                                       uint8_t                               class_id,
                                       const xcb_input_feedback_ctl_data_t  *_aux)
{
    char *xcb_out = *_buffer;
    unsigned int xcb_buffer_len = 0;
    unsigned int xcb_align_to = 0;
    unsigned int xcb_padding_offset = 0;

    unsigned int xcb_pad = 0;
    char xcb_pad0[3] = {0, 0, 0};
    struct iovec xcb_parts[24];
    unsigned int xcb_parts_idx = 0;
    unsigned int xcb_block_len = 0;
    unsigned int i;
    char *xcb_tmp;

    if(class_id == XCB_INPUT_FEEDBACK_CLASS_KEYBOARD) {
        /* xcb_input_feedback_ctl_data_t.keyboard.key */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.key;
        xcb_block_len += sizeof(xcb_input_key_code_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(xcb_input_key_code_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_input_key_code_t);
        /* xcb_input_feedback_ctl_data_t.keyboard.auto_repeat_mode */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.auto_repeat_mode;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_ctl_data_t.keyboard.key_click_percent */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.key_click_percent;
        xcb_block_len += sizeof(int8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int8_t);
        /* xcb_input_feedback_ctl_data_t.keyboard.bell_percent */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.bell_percent;
        xcb_block_len += sizeof(int8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int8_t);
        /* xcb_input_feedback_ctl_data_t.keyboard.bell_pitch */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.bell_pitch;
        xcb_block_len += sizeof(int16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int16_t);
        /* xcb_input_feedback_ctl_data_t.keyboard.bell_duration */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.bell_duration;
        xcb_block_len += sizeof(int16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int16_t);
        /* xcb_input_feedback_ctl_data_t.keyboard.led_mask */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.led_mask;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
        /* xcb_input_feedback_ctl_data_t.keyboard.led_values */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.led_values;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_POINTER) {
        /* xcb_input_feedback_ctl_data_t.pointer.pad0 */
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_block_len += sizeof(uint8_t)*2;
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t)*2;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_ctl_data_t.pointer.num */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->pointer.num;
        xcb_block_len += sizeof(int16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int16_t);
        /* xcb_input_feedback_ctl_data_t.pointer.denom */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->pointer.denom;
        xcb_block_len += sizeof(int16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int16_t);
        /* xcb_input_feedback_ctl_data_t.pointer.threshold */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->pointer.threshold;
        xcb_block_len += sizeof(int16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int16_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_STRING) {
        /* xcb_input_feedback_ctl_data_t.string.pad1 */
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_block_len += sizeof(uint8_t)*2;
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t)*2;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_ctl_data_t.string.num_keysyms */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->string.num_keysyms;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* insert padding */
        xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
        xcb_buffer_len += xcb_block_len + xcb_pad;
        if (0 != xcb_pad) {
            xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
            xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
            xcb_parts_idx++;
            xcb_pad = 0;
        }
        xcb_block_len = 0;
        xcb_padding_offset = 0;
        /* keysyms */
        xcb_parts[xcb_parts_idx].iov_base = (char *) _aux->string.keysyms;
        xcb_block_len += _aux->string.num_keysyms * sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = _aux->string.num_keysyms * sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_keysym_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_INTEGER) {
        /* xcb_input_feedback_ctl_data_t.integer.int_to_display */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->integer.int_to_display;
        xcb_block_len += sizeof(int32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int32_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_LED) {
        /* xcb_input_feedback_ctl_data_t.led.led_mask */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->led.led_mask;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
        /* xcb_input_feedback_ctl_data_t.led.led_values */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->led.led_values;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_BELL) {
        /* xcb_input_feedback_ctl_data_t.bell.percent */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->bell.percent;
        xcb_block_len += sizeof(int8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int8_t);
        /* xcb_input_feedback_ctl_data_t.bell.pad2 */
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_block_len += sizeof(uint8_t)*3;
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t)*3;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_ctl_data_t.bell.pitch */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->bell.pitch;
        xcb_block_len += sizeof(int16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int16_t);
        /* xcb_input_feedback_ctl_data_t.bell.duration */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->bell.duration;
        xcb_block_len += sizeof(int16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int16_t);
    }
    /* insert padding */
    xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
    xcb_buffer_len += xcb_block_len + xcb_pad;
    if (0 != xcb_pad) {
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
        xcb_parts_idx++;
        xcb_pad = 0;
    }
    xcb_block_len = 0;
    xcb_padding_offset = 0;

    if (NULL == xcb_out) {
        /* allocate memory */
        xcb_out = malloc(xcb_buffer_len);
        *_buffer = xcb_out;
    }

    xcb_tmp = xcb_out;
    for(i=0; i<xcb_parts_idx; i++) {
        if (0 != xcb_parts[i].iov_base && 0 != xcb_parts[i].iov_len)
            memcpy(xcb_tmp, xcb_parts[i].iov_base, xcb_parts[i].iov_len);
        if (0 != xcb_parts[i].iov_len)
            xcb_tmp += xcb_parts[i].iov_len;
    }

    return xcb_buffer_len;
}